

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void PhyloTree::getCommonEdges
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  bool bVar4;
  int originalID;
  ulong uVar5;
  pointer pPVar6;
  pointer this;
  int local_e4;
  _func_int **local_e0;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_d8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_d0;
  double local_c8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *local_c0;
  PhyloTreeEdge local_b8;
  _func_int **local_70;
  double local_68;
  double local_60;
  Bipartition local_58;
  
  pPVar6 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_d8 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)dest;
  local_d0 = t2_edges;
  local_c0 = t1_edges;
  if (pPVar6 != pPVar1) {
    uVar5 = ((long)pPVar1 - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar6,pPVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar6,pPVar1);
  }
  pPVar6 = (local_d0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (local_d0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar6 != pPVar1) {
    uVar5 = ((long)pPVar1 - (long)pPVar6 >> 3) * -0x71c71c71c71c71c7;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar6,pPVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar6,pPVar1);
  }
  pPVar6 = (local_c0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (local_c0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this = (local_d0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pPVar2 = (local_d0->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this != pPVar2 && pPVar6 != pPVar1) {
    local_e0 = (_func_int **)&PTR_toString_abi_cxx11__001bdba8;
    local_70 = (_func_int **)&PTR_toString_abi_cxx11__001bdcd8;
    do {
      a = &(pPVar6->super_Bipartition).partition;
      b = &(this->super_Bipartition).partition;
      bVar4 = boost::operator<(a,b);
      if (bVar4) {
        bVar4 = PhyloTreeEdge::isCompatibleWith(pPVar6,local_d0);
        if (bVar4) {
          PhyloTreeEdge::asSplit(&local_b8.super_Bipartition,pPVar6);
          local_c8 = PhyloTreeEdge::getAttribute(pPVar6);
          local_e4 = PhyloTreeEdge::getOriginalID(pPVar6);
          std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
          emplace_back<Bipartition,double,int>
                    (local_d8,&local_b8.super_Bipartition,&local_c8,&local_e4);
          local_b8.super_Bipartition._vptr_Bipartition = local_e0;
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_b8.super_Bipartition.partition);
          if (!bVar4) goto LAB_00148d20;
          if (local_b8.super_Bipartition.partition.m_bits.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super_Bipartition.partition.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        pPVar6 = pPVar6 + 1;
      }
      else {
        bVar4 = boost::operator<(b,a);
        if (bVar4) {
          bVar4 = PhyloTreeEdge::isCompatibleWith(this,local_c0);
          if (bVar4) {
            PhyloTreeEdge::asSplit(&local_b8.super_Bipartition,this);
            local_c8 = PhyloTreeEdge::getAttribute(this);
            local_e4 = PhyloTreeEdge::getOriginalID(this);
            std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
            emplace_back<Bipartition,double,int>
                      (local_d8,&local_b8.super_Bipartition,&local_c8,&local_e4);
            local_b8.super_Bipartition._vptr_Bipartition = local_e0;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_b8.super_Bipartition.partition);
            if (!bVar4) goto LAB_00148d20;
            if (local_b8.super_Bipartition.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.super_Bipartition.partition.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        else {
          PhyloTreeEdge::asSplit(&local_58,pPVar6);
          local_60 = PhyloTreeEdge::getLength(pPVar6);
          local_68 = PhyloTreeEdge::getLength(this);
          originalID = PhyloTreeEdge::getOriginalID(pPVar6);
          PhyloTreeEdge::PhyloTreeEdge(&local_b8,&local_58,local_60 - local_68,originalID);
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_back<PhyloTreeEdge>
                    ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8)
          ;
          local_b8.super_Bipartition._vptr_Bipartition = local_70;
          if (local_b8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.originalEdge.
                       super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      );
          }
          local_b8.super_Bipartition._vptr_Bipartition = local_e0;
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_b8.super_Bipartition.partition);
          if (!bVar4) {
LAB_00148d20:
            __assert_fail("m_check_invariants()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                          ,0x279,
                          "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                         );
          }
          if (local_b8.super_Bipartition.partition.m_bits.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_b8.super_Bipartition.partition.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_58._vptr_Bipartition = local_e0;
          bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                  m_check_invariants(&local_58.partition);
          if (!bVar4) goto LAB_00148d20;
          if (local_58.partition.m_bits.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.partition.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          pPVar6 = pPVar6 + 1;
        }
        this = this + 1;
      }
    } while ((pPVar6 != pPVar1) && (this != pPVar2));
  }
  return;
}

Assistant:

void PhyloTree::getCommonEdges(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges, vector<PhyloTreeEdge> &dest) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}